

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int ctx_get(nng_ctx id,char *n,void *v,size_t *szp,nni_type t)

{
  int iVar1;
  nni_ctx *pnStack_38;
  int rv;
  nni_ctx *ctx;
  size_t *psStack_28;
  nni_type t_local;
  size_t *szp_local;
  void *v_local;
  char *n_local;
  nng_ctx id_local;
  
  ctx._4_4_ = t;
  psStack_28 = szp;
  szp_local = (size_t *)v;
  v_local = n;
  n_local._0_4_ = id.id;
  n_local._4_4_ = nni_ctx_find(&stack0xffffffffffffffc8,id.id);
  if (n_local._4_4_ == 0) {
    iVar1 = nni_ctx_getopt(pnStack_38,(char *)v_local,szp_local,psStack_28,ctx._4_4_);
    nni_ctx_rele(pnStack_38);
    n_local._4_4_ = iVar1;
  }
  return n_local._4_4_;
}

Assistant:

static int
ctx_get(nng_ctx id, const char *n, void *v, size_t *szp, nni_type t)
{
	nni_ctx *ctx;
	int      rv;

	if ((rv = nni_ctx_find(&ctx, id.id)) != 0) {
		return (rv);
	}
	rv = nni_ctx_getopt(ctx, n, v, szp, t);
	nni_ctx_rele(ctx);
	return (rv);
}